

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O2

decNumber *
uprv_decNumberNextToward_63(decNumber *res,decNumber *lhs,decNumber *rhs,decContext *set)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint8_t negate;
  int32_t iVar4;
  rounding rVar5;
  uint32_t status;
  decContext workset;
  decNumber local_2c;
  
  workset.digits = set->digits;
  workset.emax = set->emax;
  uVar1 = set->emin;
  uVar2 = set->round;
  uVar3 = set->traps;
  workset.status = set->status;
  workset.clamp = set->clamp;
  workset._25_3_ = *(undefined3 *)&set->field_0x19;
  status = 0;
  workset.emin = uVar1;
  workset.round = uVar2;
  workset.traps = uVar3;
  if (((lhs->bits & 0x30) == 0) && ((rhs->bits & 0x30) == 0)) {
    iVar4 = decCompare(lhs,rhs,'\0');
    if (iVar4 != 0) {
      if (iVar4 < 0) {
        rVar5 = DEC_ROUND_CEILING;
        negate = '\0';
        if (0xbf < lhs->bits) {
          decSetMaxValue(res,set);
          res->bits = 0x80;
          return res;
        }
      }
      else {
        if ((lhs->bits & 0xc0) == 0x40) {
          decSetMaxValue(res,set);
          return res;
        }
        negate = 0x80;
        rVar5 = DEC_ROUND_FLOOR;
      }
      local_2c.bits = '\0';
      local_2c.lsu[0] = '\x01';
      local_2c.digits = 1;
      local_2c.exponent = -1000000000;
      workset.round = rVar5;
      decAddOp(res,lhs,&local_2c,&workset,negate,&status);
      iVar4 = uprv_decNumberIsNormal_63(res,set);
      if (status == 0 || iVar4 != 0) {
        return res;
      }
      goto LAB_002c48e5;
    }
    uprv_decNumberCopySign_63(res,lhs,rhs);
  }
  else {
    decNaNs(res,lhs,rhs,set,&status);
  }
  if (status == 0) {
    return res;
  }
LAB_002c48e5:
  decStatus(res,status,set);
  return res;
}

Assistant:

U_CAPI decNumber * U_EXPORT2 uprv_decNumberNextToward(decNumber *res, const decNumber *lhs,
                                const decNumber *rhs, decContext *set) {
  decNumber dtiny;                           /* constant  */
  decContext workset=*set;                   /* work  */
  Int result;                                /* ..  */
  uInt status=0;                             /* accumulator  */
  #if DECCHECK
  if (decCheckOperands(res, lhs, rhs, set)) return res;
  #endif

  if (decNumberIsNaN(lhs) || decNumberIsNaN(rhs)) {
    decNaNs(res, lhs, rhs, set, &status);
    }
   else { /* Is numeric, so no chance of sNaN Invalid, etc.  */
    result=decCompare(lhs, rhs, 0);     /* sign matters  */
    if (result==BADINT) status|=DEC_Insufficient_storage; /* rare  */
     else { /* valid compare  */
      if (result==0) uprv_decNumberCopySign(res, lhs, rhs); /* easy  */
       else { /* differ: need NextPlus or NextMinus  */
        uByte sub;                      /* add or subtract  */
        if (result<0) {                 /* lhs<rhs, do nextplus  */
          /* -Infinity is the special case  */
          if ((lhs->bits&(DECINF|DECNEG))==(DECINF|DECNEG)) {
            decSetMaxValue(res, set);
            res->bits=DECNEG;           /* negative  */
            return res;                 /* there is no status to set  */
            }
          workset.round=DEC_ROUND_CEILING;
          sub=0;                        /* add, please  */
          } /* plus  */
         else {                         /* lhs>rhs, do nextminus  */
          /* +Infinity is the special case  */
          if ((lhs->bits&(DECINF|DECNEG))==DECINF) {
            decSetMaxValue(res, set);
            return res;                 /* there is no status to set  */
            }
          workset.round=DEC_ROUND_FLOOR;
          sub=DECNEG;                   /* subtract, please  */
          } /* minus  */
        uprv_decNumberZero(&dtiny);          /* start with 0  */
        dtiny.lsu[0]=1;                 /* make number that is ..  */
        dtiny.exponent=DEC_MIN_EMIN-1;  /* .. smaller than tiniest  */
        decAddOp(res, lhs, &dtiny, &workset, sub, &status); /* + or -  */
        /* turn off exceptions if the result is a normal number  */
        /* (including Nmin), otherwise let all status through  */
        if (uprv_decNumberIsNormal(res, set)) status=0;
        } /* unequal  */
      } /* compare OK  */
    } /* numeric  */
  if (status!=0) decStatus(res, status, set);
  return res;
  }